

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalLut.c
# Opt level: O0

Gia_Man_t * Gia_ManBalanceInt(Gia_Man_t *p,int nLutSize,int nCutNum,int fVerbose)

{
  int iVar1;
  uint uVar2;
  Gia_Man_t *p_00;
  char *pcVar3;
  uint *puVar4;
  Vec_Int_t *pVVar5;
  Gia_Obj_t *pGVar6;
  Bal_Man_t *p_01;
  Gia_Man_t *pGVar7;
  bool bVar8;
  uint local_48;
  int local_44;
  int nLevelMax;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *pTemp;
  Gia_Man_t *pNew;
  Bal_Man_t *pMan;
  int fVerbose_local;
  int nCutNum_local;
  int nLutSize_local;
  Gia_Man_t *p_local;
  
  Gia_ManFillValue(p);
  Gia_ManCreateRefs(p);
  iVar1 = Gia_ManObjNum(p);
  p_00 = Gia_ManStart((iVar1 * 3) / 2);
  pcVar3 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar3;
  pcVar3 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar3;
  puVar4 = (uint *)calloc((long)p_00->nObjsAlloc,4);
  p_00->pMuxes = puVar4;
  pVVar5 = Vec_IntStart(p_00->nObjsAlloc);
  p_00->vLevels = pVVar5;
  pGVar6 = Gia_ManConst0(p);
  pGVar6->Value = 0;
  local_44 = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p->vCis);
    bVar8 = false;
    if (local_44 < iVar1) {
      _nLevelMax = Gia_ManCi(p,local_44);
      bVar8 = _nLevelMax != (Gia_Obj_t *)0x0;
    }
    if (!bVar8) break;
    uVar2 = Gia_ManAppendCi(p_00);
    _nLevelMax->Value = uVar2;
    local_44 = local_44 + 1;
  }
  p_01 = Bal_ManAlloc(p,p_00,nLutSize,nCutNum,fVerbose);
  Gia_ManHashStart(p_00);
  local_44 = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p->vCos);
    bVar8 = false;
    if (local_44 < iVar1) {
      _nLevelMax = Gia_ManCo(p,local_44);
      bVar8 = _nLevelMax != (Gia_Obj_t *)0x0;
    }
    if (!bVar8) break;
    pGVar6 = Gia_ObjFanin0(_nLevelMax);
    Gia_ManBalance_rec(p_00,p,pGVar6);
    local_44 = local_44 + 1;
  }
  local_44 = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p->vCos);
    bVar8 = false;
    if (local_44 < iVar1) {
      _nLevelMax = Gia_ManCo(p,local_44);
      bVar8 = _nLevelMax != (Gia_Obj_t *)0x0;
    }
    if (!bVar8) break;
    iVar1 = Gia_ObjFanin0Copy(_nLevelMax);
    uVar2 = Gia_ManAppendCo(p_00,iVar1);
    _nLevelMax->Value = uVar2;
    local_44 = local_44 + 1;
  }
  local_48 = 0;
  local_44 = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p_00->vCos);
    bVar8 = false;
    if (local_44 < iVar1) {
      _nLevelMax = Gia_ManCo(p_00,local_44);
      bVar8 = _nLevelMax != (Gia_Obj_t *)0x0;
    }
    if (!bVar8) break;
    iVar1 = Gia_ObjFaninId0p(p_00,_nLevelMax);
    iVar1 = Bal_ObjDelay(p_01,iVar1);
    local_48 = Abc_MaxInt(local_48,iVar1);
    local_44 = local_44 + 1;
  }
  printf("Best delay = %d\n",(ulong)local_48);
  Gia_ManHashStop(p_00);
  iVar1 = Gia_ManRegNum(p);
  Gia_ManSetRegNum(p_00,iVar1);
  Bal_ManFree(p_01);
  pGVar7 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  return pGVar7;
}

Assistant:

static inline Gia_Man_t * Gia_ManBalanceInt( Gia_Man_t * p, int nLutSize, int nCutNum, int fVerbose )
{
    Bal_Man_t * pMan;
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj;
    int i;
    Gia_ManFillValue( p );
    Gia_ManCreateRefs( p ); 
    // start the new manager
    pNew = Gia_ManStart( 3*Gia_ManObjNum(p)/2 );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    pNew->pMuxes = ABC_CALLOC( unsigned, pNew->nObjsAlloc );
    pNew->vLevels = Vec_IntStart( pNew->nObjsAlloc );
    // create constant and inputs
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    // create balancing manager
    pMan = Bal_ManAlloc( p, pNew, nLutSize, nCutNum, fVerbose );
    // create internal nodes
    Gia_ManHashStart( pNew );
    Gia_ManForEachCo( p, pObj, i )
        Gia_ManBalance_rec( pNew, p, Gia_ObjFanin0(pObj) );
    Gia_ManForEachCo( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
//    if ( fVerbose )
    {
        int nLevelMax = 0;
        Gia_ManForEachCo( pNew, pObj, i )
        {
            nLevelMax = Abc_MaxInt( nLevelMax, Bal_ObjDelay(pMan, Gia_ObjFaninId0p(pNew, pObj)) );
//            printf( "%d=%d ", i, Bal_ObjDelay(pMan, Gia_ObjFaninId0p(pNew, pObj)) );
        }
        printf( "Best delay = %d\n", nLevelMax );
    }

//    assert( Gia_ManObjNum(pNew) <= Gia_ManObjNum(p) );
    Gia_ManHashStop( pNew );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    // delete manager
    Bal_ManFree( pMan );
    // perform cleanup
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}